

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O2

sexp sexp_bignum_quot_rem(sexp ctx,sexp_conflict *rem,sexp a,sexp b)

{
  sexp_conflict psVar1;
  char cVar2;
  sexp_uint_t sVar3;
  sexp psVar4;
  sexp_sint_t sVar5;
  sexp psVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  undefined1 auVar13 [16];
  sexp local_110;
  sexp local_108;
  sexp b1;
  sexp x;
  sexp local_f0;
  sexp local_e8;
  long local_e0;
  sexp_uint_t local_d8;
  ulong local_d0;
  ulong local_c8;
  sexp local_c0;
  sexp y;
  sexp local_b0;
  sexp_conflict *local_a8;
  ulong local_a0;
  sexp_uint_t local_98;
  ulong local_90;
  sexp local_88;
  sexp *local_80;
  sexp_gc_var_t *local_78;
  sexp_gc_var_t local_70;
  sexp_gc_var_t local_60;
  sexp_gc_var_t local_50;
  sexp *local_40;
  sexp **local_38;
  
  local_d8 = sexp_bignum_hi(b);
  local_108 = (sexp)0x43e;
  x = (sexp)&DAT_0000043e;
  y = (sexp)&DAT_0000043e;
  local_110 = (sexp)0x43e;
  b1 = (sexp)&DAT_0000043e;
  if ((local_d8 == 1) && ((b->value).type.slots == (sexp)0x0)) {
    psVar6 = sexp_xtype_exception(ctx,(sexp)0x0,"divide by zero",a);
    return psVar6;
  }
  local_80 = &local_108;
  local_38 = &local_80;
  local_78 = (ctx->value).context.saves;
  local_40 = &x;
  local_50.next = (sexp_gc_var_t *)&local_40;
  local_50.var = &y;
  local_60.next = &local_50;
  local_60.var = &local_110;
  local_70.next = &local_60;
  local_70.var = &b1;
  (ctx->value).context.saves = &local_70;
  local_e8 = b;
  local_110 = sexp_copy_bignum(ctx,(sexp)0x0,a,0);
  (local_110->value).flonum_bits[0] = '\x01';
  if (local_d8 == 1) {
    psVar4 = ctx;
    b1 = sexp_make_bignum(ctx,1);
    psVar6 = local_e8;
    sVar3 = sexp_bignum_fxdiv(psVar4,local_110,(local_e8->value).string.length,0);
    (b1->value).string.length = sVar3;
    psVar4 = sexp_bignum_normalize(b1);
    *rem = psVar4;
    cVar2 = (a->value).flonum_bits[0];
    if ((int)(psVar6->value).flonum_bits[0] * (int)cVar2 < 0) {
      if ((((ulong)local_110 & 3) == 0) && (local_110->tag == 0xc)) {
        (local_110->value).flonum_bits[0] = -(local_110->value).flonum_bits[0];
        cVar2 = (a->value).flonum_bits[0];
      }
      else if (((ulong)local_110 & 1) != 0) {
        local_110 = (sexp)(1 - ((ulong)local_110 & 0xfffffffffffffffe));
      }
    }
    if (cVar2 < '\0') {
      psVar1 = *rem;
      if ((((ulong)psVar1 & 3) == 0) && (psVar1->tag == 0xc)) {
        (psVar1->value).flonum_bits[0] = -(psVar1->value).flonum_bits[0];
      }
      else if (((ulong)psVar1 & 1) != 0) {
        *rem = (sexp_conflict)(1 - ((ulong)psVar1 & 0xfffffffffffffffe));
      }
    }
    (ctx->value).context.saves = local_78;
  }
  else {
    lVar11 = 1;
    lVar8 = 0;
    local_a8 = rem;
    b1 = sexp_copy_bignum(ctx,(sexp)0x0,local_e8,0);
    (b1->value).flonum_bits[0] = '\x01';
    local_108 = (sexp)&DAT_00000001;
    local_b0 = a;
    x = sexp_make_bignum(ctx,(a->value).string.offset);
    local_f0 = ctx;
    local_e0 = lVar11;
    while (psVar4 = b1, psVar6 = local_110, sVar5 = sexp_bignum_compare_abs(local_110,b1),
          -1 < sVar5) {
      local_98 = sexp_bignum_hi(psVar6);
      *(undefined8 *)((long)&x->value + lVar8 * 8 + 0x10) = 0;
      if (0 < lVar8) {
        *(undefined8 *)((long)&x->value + lVar8 * 8 + 8) = 0;
      }
      local_c0 = x;
      local_c8 = *(ulong *)((long)&psVar6->value + local_98 * 8);
      local_90 = *(ulong *)((long)&psVar6->value + local_98 * 8 + 8);
      local_a0 = *(ulong *)((long)&psVar4->value + local_d8 * 8);
      local_d0 = *(ulong *)((long)&psVar4->value + local_d8 * 8 + 8);
      uVar7 = local_d0;
      uVar9 = local_90;
      uVar10 = local_a0;
      uVar12 = local_c8;
      if ((((2 < (long)local_d8) && (2 < (long)local_98)) && (local_90 >> 0x20 == 0)) &&
         (local_d0 >> 0x20 == 0)) {
        uVar7 = local_d0 << 0x20 | local_a0 >> 0x20;
        uVar9 = local_90 << 0x20 | local_c8 >> 0x20;
        uVar10 = (ulong)*(uint *)(&psVar4->markedp + local_d8 * 8) | local_a0 << 0x20;
        uVar12 = (ulong)*(uint *)(&psVar6->markedp + local_98 * 8) | local_c8 << 0x20;
      }
      local_88 = psVar4;
      lVar8 = local_98 - local_d8;
      auVar13 = __udivti3(uVar12,uVar9,uVar10,uVar7);
      lVar11 = local_e0;
      ctx = local_f0;
      if (uVar9 < uVar7 || uVar9 - uVar7 < (ulong)(uVar12 < uVar10)) {
        uVar7 = local_d0;
        uVar9 = local_90;
        uVar10 = local_c8;
        if ((local_90 >> 0x20 == 0) && (local_d0 >> 0x20 == 0)) {
          uVar7 = local_d0 << 0x20 | local_a0 >> 0x20;
          uVar9 = local_90 << 0x20 | local_c8 >> 0x20;
          uVar10 = local_c8 << 0x20 | (ulong)*(uint *)(&psVar6->markedp + local_98 * 8);
        }
        auVar13 = __udivti3(uVar10,uVar9,uVar7,0);
      }
      else {
        lVar8 = lVar8 + 1;
      }
      *(long *)((long)&local_c0->value + lVar8 * 8 + 0x10) = auVar13._8_8_;
      if (0 < lVar8) {
        *(long *)((long)&local_c0->value + lVar8 * 8 + 8) = auVar13._0_8_;
      }
      y = sexp_bignum_mul(ctx,(sexp)0x0,local_88,local_c0);
      if (lVar11 < 0) {
        local_110 = sexp_bignum_add(ctx,(sexp)0x0,local_110,y);
        local_108 = sexp_sub(ctx,local_108,x);
      }
      else {
        local_110 = sexp_bignum_sub(ctx,(sexp)0x0,local_110,y);
        local_108 = sexp_add(ctx,local_108,x);
      }
      if (lVar11 != (local_110->value).flonum_bits[0]) {
        (local_110->value).flonum_bits[0] = -(char)lVar11;
        lVar11 = -lVar11;
        local_e0 = lVar11;
      }
    }
    local_110 = sexp_bignum_normalize(psVar6);
    if (local_110 != (sexp)&DAT_00000001 && lVar11 < 0) {
      local_108 = sexp_sub(ctx,local_108,(sexp)&DAT_00000003);
      local_110 = sexp_add(ctx,local_110,b1);
    }
    *local_a8 = local_110;
    cVar2 = (local_b0->value).flonum_bits[0];
    if ((int)(local_e8->value).flonum_bits[0] * (int)cVar2 < 0) {
      if ((((ulong)local_108 & 3) == 0) && (local_108->tag == 0xc)) {
        (local_108->value).flonum_bits[0] = -(local_108->value).flonum_bits[0];
        cVar2 = (local_b0->value).flonum_bits[0];
      }
      else if (((ulong)local_108 & 1) != 0) {
        local_108 = (sexp)(1 - ((ulong)local_108 & 0xfffffffffffffffe));
      }
    }
    if (cVar2 < '\0') {
      psVar1 = *local_a8;
      if ((((ulong)psVar1 & 3) == 0) && (psVar1->tag == 0xc)) {
        (psVar1->value).flonum_bits[0] = -(psVar1->value).flonum_bits[0];
      }
      else if (((ulong)psVar1 & 1) != 0) {
        *local_a8 = (sexp_conflict)(1 - ((ulong)psVar1 & 0xfffffffffffffffe));
      }
    }
    (ctx->value).context.saves = local_78;
    local_110 = local_108;
  }
  return local_110;
}

Assistant:

sexp sexp_bignum_quot_rem (sexp ctx, sexp *rem, sexp a, sexp b) {
  sexp_luint_t d, dn, dd;
  sexp_uint_t dlo, dhi;
  sexp_sint_t alen, blen=sexp_bignum_hi(b), sign=1, off=0;
  sexp_gc_var5(q, x, y, a1, b1);
  if (blen == 1 && sexp_bignum_data(b)[0] == 0)
    return sexp_xtype_exception(ctx, NULL, "divide by zero", a);
  sexp_gc_preserve5(ctx, q, x, y, a1, b1);
  a1 = sexp_copy_bignum(ctx, NULL, a, 0);
  sexp_bignum_sign(a1) = 1;
  /* fast path for single bigit divisor */
  if (blen == 1) {
    b1 = sexp_make_bignum(ctx, 1);
    sexp_bignum_data(b1)[0] = sexp_bignum_fxdiv(ctx, a1, sexp_bignum_data(b)[0], 0);
    *rem = sexp_bignum_normalize(b1);
    if (sexp_bignum_sign(a) * sexp_bignum_sign(b) < 0) {
      sexp_negate_exact(a1);
    }
    if (sexp_bignum_sign(a) < 0) {
      sexp_negate_exact(*rem);
    }
    sexp_gc_release5(ctx);
    return a1;
  }
  /* general case */
  b1 = sexp_copy_bignum(ctx, NULL, b, 0);
  sexp_bignum_sign(b1) = 1;
  q = SEXP_ZERO;
  x = sexp_make_bignum(ctx, sexp_bignum_length(a));
  while (sexp_bignum_compare_abs(a1, b1) >= 0) { /* a1, b1 at least 2 bigits */
    /* guess divisor x */
    alen = sexp_bignum_hi(a1);
    sexp_bignum_data(x)[off] = 0;
    if (off > 0) sexp_bignum_data(x)[off-1] = 0;
    off = alen - blen + 1;
    dn = luint_add_uint(luint_shl(luint_from_uint(sexp_bignum_data(a1)[alen-1])
           , (sizeof(sexp_uint_t)*8))
          , sexp_bignum_data(a1)[alen-2]);
    dd = luint_add_uint(luint_shl(luint_from_uint(sexp_bignum_data(b1)[blen-1])
           , (sizeof(sexp_uint_t)*8))
          , sexp_bignum_data(b1)[blen-2]);
    if (alen > 2 && blen > 2 &&
        luint_lt(luint_from_uint(sexp_bignum_data(a1)[alen-1]), luint_shl(luint_from_uint(1), (sizeof(sexp_uint_t)*4))) &&
        luint_lt(luint_from_uint(sexp_bignum_data(b1)[blen-1]), luint_shl(luint_from_uint(1), (sizeof(sexp_uint_t)*4)))) {
      dn = luint_add_uint(luint_shl(dn, (sizeof(sexp_uint_t)*4))
        , (sexp_bignum_data(a1)[alen-3] >> (sizeof(sexp_uint_t)*4)));
      dd = luint_add_uint(luint_shl(dd, (sizeof(sexp_uint_t)*4))
        , (sexp_bignum_data(b1)[blen-3] >> (sizeof(sexp_uint_t)*4)));
    }
    d = luint_div(dn, dd);
    if (luint_eq(d, luint_from_uint(0))) {
      dn = luint_add_uint(luint_shl(luint_from_uint(sexp_bignum_data(a1)[alen-1])
             , (sizeof(sexp_uint_t)*8))
            , sexp_bignum_data(a1)[alen-2]);
      dd = luint_from_uint(sexp_bignum_data(b1)[blen-1]);
      if (luint_lt(luint_from_uint(sexp_bignum_data(a1)[alen-1]), (luint_shl(luint_from_uint(1), (sizeof(sexp_uint_t)*4)))) &&
          luint_lt(luint_from_uint(sexp_bignum_data(b1)[blen-1]), (luint_shl(luint_from_uint(1), (sizeof(sexp_uint_t)*4))))) {
        dn = luint_add_uint(luint_shl(dn, (sizeof(sexp_uint_t)*4))
          , (sexp_bignum_data(a1)[alen-3] >> (sizeof(sexp_uint_t)*4)));
        dd = luint_add_uint(luint_shl(dd, (sizeof(sexp_uint_t)*4))
          , (sexp_bignum_data(b1)[blen-2] >> (sizeof(sexp_uint_t)*4)));
      }
      d = luint_div(dn, dd);
      off--;
    }
    dhi = luint_to_uint(luint_shr(d, (sizeof(sexp_uint_t)*8)));
    dlo = luint_to_uint(luint_and(d, luint_sub(luint_shl(luint_from_uint(1), (sizeof(sexp_uint_t)*8)), luint_from_uint(1))));
    sexp_bignum_data(x)[off] = dhi;
    if (off > 0) sexp_bignum_data(x)[off-1] = dlo;
    /* update quotient q and remainder a1 estimates */
    y = sexp_bignum_mul(ctx, NULL, b1, x);
    if (sign < 0) {
      a1 = sexp_bignum_add(ctx, NULL, a1, y);
      q = sexp_sub(ctx, q, x);
    } else {
      a1 = sexp_bignum_sub(ctx, NULL, a1, y);
      q = sexp_add(ctx, q, x);
    }
    /* flip the sign if we overshot in our estimate */
    if (sexp_bignum_sign(a1) != sign) {
      sexp_bignum_sign(a1) = (char)(-sign);
      sign *= -1;
    }
  }
  /* adjust signs */
  a1 = sexp_bignum_normalize(a1);
  if (sign < 0 && a1 != SEXP_ZERO) {
    q = sexp_sub(ctx, q, SEXP_ONE);
    a1 = sexp_add(ctx, a1, b1);
  }
  *rem = a1;
  if (sexp_bignum_sign(a) * sexp_bignum_sign(b) < 0) {
    sexp_negate_exact(q);
  }
  if (sexp_bignum_sign(a) < 0) {
    sexp_negate_exact(*rem);
  }
  sexp_gc_release5(ctx);
  return q;
}